

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool regime_is_user(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  
  if (mmu_idx != ARMMMUIdx_E10_0) {
    if (mmu_idx != ARMMMUIdx_E20_0) {
      if (mmu_idx - ARMMMUIdx_E10_1 < 2) goto LAB_0070480d;
      if ((((mmu_idx != ARMMMUIdx_SE10_0) && (mmu_idx != ARMMMUIdx_Stage1_E0)) &&
          (mmu_idx != ARMMMUIdx_MUser)) &&
         (((mmu_idx != ARMMMUIdx_MUserNegPri && (mmu_idx != ARMMMUIdx_MSUser)) &&
          (mmu_idx != ARMMMUIdx_MSUserNegPri)))) {
        return false;
      }
    }
    return true;
  }
LAB_0070480d:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
             ,0x2386,(char *)0x0);
}

Assistant:

static inline bool regime_is_user(CPUARMState *env, ARMMMUIdx mmu_idx)
{
    switch (mmu_idx) {
    case ARMMMUIdx_SE10_0:
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_Stage1_E0:
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MSUser:
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MSUserNegPri:
        return true;
    default:
        return false;
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
        g_assert_not_reached();
        // never reach here
        return false;
    }
}